

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldLiteGenerator::GenerateInterfaceMembers
          (ImmutableMessageFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *descriptor;
  OneofDescriptor *pOVar2;
  Printer *printer_local;
  ImmutableMessageFieldLiteGenerator *this_local;
  
  descriptor = FieldDescriptor::file(this->descriptor_);
  bVar1 = SupportFieldPresence(descriptor);
  if (!bVar1) {
    pOVar2 = FieldDescriptor::containing_oneof(this->descriptor_);
    if (pOVar2 != (OneofDescriptor *)0x0) goto LAB_0046e259;
  }
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,"$deprecation$boolean has$capitalized_name$();\n");
LAB_0046e259:
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,"$deprecation$$type$ get$capitalized_name$();\n");
  return;
}

Assistant:

void ImmutableMessageFieldLiteGenerator::
GenerateInterfaceMembers(io::Printer* printer) const {
  // TODO(jonp): In the future, consider having a method specific to the
  // interface so that builders can choose dynamically to either return a
  // message or a nested builder, so that asking for the interface doesn't
  // cause a message to ever be built.
  if (SupportFieldPresence(descriptor_->file()) ||
      descriptor_->containing_oneof() == NULL) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$boolean has$capitalized_name$();\n");
  }
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$$type$ get$capitalized_name$();\n");
}